

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Position.cpp
# Opt level: O3

SpatialMotionVector * __thiscall
iDynTree::Position::changePointOf(Position *this,SpatialMotionVector *other)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  SpatialMotionVector *result;
  SpatialMotionVector *in_RDI;
  
  dVar1 = (other->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
          m_data[0];
  dVar2 = (this->super_Vector3).m_data[0];
  dVar5 = (this->super_Vector3).m_data[1];
  dVar6 = (this->super_Vector3).m_data[2];
  dVar7 = (other->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
          m_data[1];
  dVar8 = (other->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
          m_data[2];
  dVar4 = (other->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.
          m_data[1] + (dVar1 * dVar6 - dVar2 * dVar8);
  auVar3._8_4_ = SUB84(dVar4,0);
  auVar3._0_8_ = (other->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.
                 super_Vector3.m_data[0] + (dVar8 * dVar5 - dVar6 * dVar7);
  auVar3._12_4_ = (int)((ulong)dVar4 >> 0x20);
  *(undefined1 (*) [16])
   (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data =
       auVar3;
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data[2] =
       (dVar2 * dVar7 - dVar1 * dVar5) +
       (other->super_SpatialVector<iDynTree::SpatialMotionVector>).linearVec3.super_Vector3.m_data
       [2];
  dVar1 = (other->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.
          m_data[1];
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[0] =
       (other->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data
       [0];
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[1] =
       dVar1;
  (in_RDI->super_SpatialVector<iDynTree::SpatialMotionVector>).angularVec3.super_Vector3.m_data[2] =
       dVar8;
  return in_RDI;
}

Assistant:

SpatialMotionVector Position::changePointOf(const SpatialMotionVector & other) const
    {
        SpatialMotionVector result;

        Eigen::Map<const Eigen::Vector3d> thisPos(this->data());
        Eigen::Map<const Eigen::Vector3d> otherLinear(other.getLinearVec3().data());
        Eigen::Map<const Eigen::Vector3d> otherAngular(other.getAngularVec3().data());
        Eigen::Map<Eigen::Vector3d> resLinear(result.getLinearVec3().data());
        Eigen::Map<Eigen::Vector3d> resAngular(result.getAngularVec3().data());

        resLinear  = otherLinear + thisPos.cross(otherAngular);
        resAngular = otherAngular;

        return result;
    }